

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int LoadEXRFromMemory(float *out_rgba,uchar *memory,char **err)

{
  char cVar1;
  uchar *puVar2;
  uchar *puVar3;
  uchar *puVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  float fVar13;
  EXRImage exrImage;
  EXRImage EStack_1078;
  
  if (out_rgba == (float *)0x0 || memory == (uchar *)0x0) {
    if (err != (char **)0x0) {
      *err = "Invalid argument.\n";
      return -1;
    }
    return -1;
  }
  EStack_1078.images = (uchar **)0x0;
  EStack_1078.pixel_types = (int *)0x0;
  EStack_1078.num_custom_attributes = 0;
  EStack_1078.num_channels = 0;
  EStack_1078.channel_names = (char **)0x0;
  EStack_1078.requested_pixel_types = (int *)0x0;
  iVar5 = LoadMultiChannelEXRFromMemory(&EStack_1078,memory,err);
  if (iVar5 != 0) {
    return iVar5;
  }
  if (0 < (long)EStack_1078.num_channels) {
    uVar6 = 0xffffffff;
    uVar11 = 0;
    uVar8 = 0xffffffff;
    uVar9 = 0xffffffff;
    uVar10 = 0xffffffff;
    do {
      pcVar7 = EStack_1078.channel_names[uVar11];
      cVar1 = *pcVar7;
      if (cVar1 == 'R') {
        if (pcVar7[1] == '\0') {
          uVar10 = uVar11 & 0xffffffff;
        }
      }
      else if (cVar1 == 'A') {
        if (pcVar7[1] == '\0') {
          uVar6 = uVar11 & 0xffffffff;
        }
      }
      else if (cVar1 == 'B') {
        if (pcVar7[1] == '\0') {
          uVar8 = uVar11 & 0xffffffff;
        }
      }
      else if ((cVar1 == 'G') && (pcVar7[1] == '\0')) {
        uVar9 = uVar11 & 0xffffffff;
      }
      uVar11 = uVar11 + 1;
    } while ((long)EStack_1078.num_channels != uVar11);
    if ((int)uVar10 != -1) {
      if ((int)uVar9 == -1) {
        if (err == (char **)0x0) {
          return -1;
        }
        pcVar7 = "G channel not found\n";
      }
      else {
        if ((int)uVar8 != -1) {
          if (0 < EStack_1078.height * EStack_1078.width) {
            puVar2 = EStack_1078.images[(int)uVar10];
            puVar3 = EStack_1078.images[(int)uVar9];
            puVar4 = EStack_1078.images[(int)uVar8];
            lVar12 = 0;
            do {
              out_rgba[lVar12] = *(float *)(puVar2 + lVar12);
              out_rgba[lVar12 + 1] = *(float *)(puVar3 + lVar12);
              out_rgba[lVar12 + 2] = *(float *)(puVar4 + lVar12);
              fVar13 = 1.0;
              if (0 < (int)uVar6) {
                fVar13 = *(float *)(EStack_1078.images[uVar6] + lVar12);
              }
              out_rgba[lVar12 + 3] = fVar13;
              lVar12 = lVar12 + 4;
            } while ((ulong)(uint)(EStack_1078.height * EStack_1078.width) << 2 != lVar12);
          }
          return 0;
        }
        if (err == (char **)0x0) {
          return -1;
        }
        pcVar7 = "B channel not found\n";
      }
      goto LAB_0019697b;
    }
  }
  if (err == (char **)0x0) {
    return -1;
  }
  pcVar7 = "R channel not found\n";
LAB_0019697b:
  *err = pcVar7;
  return -1;
}

Assistant:

int LoadEXRFromMemory(float *out_rgba, const unsigned char *memory,
                      const char **err) {

  if (out_rgba == NULL || memory == NULL) {
    if (err) {
      (*err) = "Invalid argument.\n";
    }
    return -1;
  }

  EXRImage exrImage;
  InitEXRImage(&exrImage);
  int ret = LoadMultiChannelEXRFromMemory(&exrImage, memory, err);
  if (ret != 0) {
    return ret;
  }

  // RGBA
  int idxR = -1;
  int idxG = -1;
  int idxB = -1;
  int idxA = -1;
  for (int c = 0; c < exrImage.num_channels; c++) {
    if (strcmp(exrImage.channel_names[c], "R") == 0) {
      idxR = c;
    } else if (strcmp(exrImage.channel_names[c], "G") == 0) {
      idxG = c;
    } else if (strcmp(exrImage.channel_names[c], "B") == 0) {
      idxB = c;
    } else if (strcmp(exrImage.channel_names[c], "A") == 0) {
      idxA = c;
    }
  }

  if (idxR == -1) {
    if (err) {
      (*err) = "R channel not found\n";
    }

    // @todo { free exrImage }
    return -1;
  }

  if (idxG == -1) {
    if (err) {
      (*err) = "G channel not found\n";
    }
    // @todo { free exrImage }
    return -1;
  }

  if (idxB == -1) {
    if (err) {
      (*err) = "B channel not found\n";
    }
    // @todo { free exrImage }
    return -1;
  }

  // Assume `out_rgba` have enough memory allocated.
  for (int i = 0; i < exrImage.width * exrImage.height; i++) {
    out_rgba[4 * i + 0] = reinterpret_cast<float **>(exrImage.images)[idxR][i];
    out_rgba[4 * i + 1] = reinterpret_cast<float **>(exrImage.images)[idxG][i];
    out_rgba[4 * i + 2] = reinterpret_cast<float **>(exrImage.images)[idxB][i];
    if (idxA > 0) {
      out_rgba[4 * i + 3] =
          reinterpret_cast<float **>(exrImage.images)[idxA][i];
    } else {
      out_rgba[4 * i + 3] = 1.0;
    }
  }

  return 0;
}